

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void __thiscall CTcSymObjBase::add_template(CTcSymObjBase *this,CTcObjTemplate *tpl)

{
  CTcObjTemplate **ppCVar1;
  
  ppCVar1 = &this->template_tail_->nxt_;
  if (this->template_tail_ == (CTcObjTemplate *)0x0) {
    ppCVar1 = &this->template_head_;
  }
  *ppCVar1 = tpl;
  this->template_tail_ = tpl;
  return;
}

Assistant:

void CTcSymObjBase::add_template(CTcObjTemplate *tpl)
{
    /* link it in at the tail of our list */
    if (template_tail_ != 0)
        template_tail_->nxt_ = tpl;
    else
        template_head_ = tpl;
    template_tail_ = tpl;
}